

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZ77_test.cpp
# Opt level: O2

void __thiscall CheckLz77Node::test_method(CheckLz77Node *this)

{
  undefined4 local_e8;
  undefined4 local_e4;
  undefined **local_e0;
  undefined1 local_d8;
  undefined8 *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x2f);
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0010e998;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = "";
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
  ;
  local_58 = "";
  local_e8 = CONCAT31(local_e8._1_3_,0x61);
  local_e4 = CONCAT31(local_e4._1_3_,0x61);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,char>
            (&local_e0,&local_60,0x2f,1,2,&local_e8,"node.get_symbol()",&local_e4,"\'a\'");
  local_70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x30);
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0010e998;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
  ;
  local_88 = "";
  local_e8 = 0x2a;
  local_e4 = local_e8;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_e0,&local_90,0x30,1,2,&local_e8,"node.get_offset()",&local_e4,"42");
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x31);
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0010e998;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = "";
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
  ;
  local_b8 = "";
  local_e8 = 0x15;
  local_e4 = local_e8;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_e0,&local_c0,0x31,1,2,&local_e8,"node.get_amount()",&local_e4,"21");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(CheckLz77Node) {
  const auto node = Lz77Node('a', 42, 21);

  BOOST_CHECK_EQUAL(node.get_symbol(), 'a');
  BOOST_CHECK_EQUAL(node.get_offset(), 42);
  BOOST_CHECK_EQUAL(node.get_amount(), 21);
}